

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void cmCacheManager::OutputKey(ostream *fout,string *key)

{
  char *pcVar1;
  long lVar2;
  ostream *poVar3;
  bool bVar4;
  char *q;
  string *key_local;
  ostream *fout_local;
  
  lVar2 = std::__cxx11::string::find((char)key,0x3a);
  bVar4 = true;
  if (lVar2 == -1) {
    lVar2 = std::__cxx11::string::find((char *)key,0x8acdc5);
    bVar4 = lVar2 == 0;
  }
  pcVar1 = "PK\x01\x02";
  if (bVar4) {
    pcVar1 = "\n\t\t\t\"";
  }
  poVar3 = std::operator<<(fout,pcVar1 + 4);
  poVar3 = std::operator<<(poVar3,(string *)key);
  std::operator<<(poVar3,pcVar1 + 4);
  return;
}

Assistant:

void cmCacheManager::OutputKey(std::ostream& fout, std::string const& key)
{
  // support : in key name by double quoting
  const char* q =
    (key.find(':') != std::string::npos || key.find("//") == 0) ? "\"" : "";
  fout << q << key << q;
}